

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  Descriptor *pDVar2;
  FileDescriptor *this_00;
  _func_int **in_RSI;
  ExtensionGenerator *in_RDI;
  Descriptor *in_stack_ffffffffffffff50;
  FileDescriptor *descriptor_00;
  ClassNameResolver *in_stack_ffffffffffffff58;
  string local_68 [32];
  string local_48 [56];
  _func_int **local_10;
  
  local_10 = in_RSI;
  ExtensionGenerator::ExtensionGenerator(in_RDI);
  in_RDI->_vptr_ExtensionGenerator = (_func_int **)&PTR__ImmutableExtensionLiteGenerator_00896e70;
  in_RDI[1]._vptr_ExtensionGenerator = local_10;
  pCVar1 = Context::GetNameResolver((Context *)0x580a62);
  in_RDI[2]._vptr_ExtensionGenerator = (_func_int **)pCVar1;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  pDVar2 = FieldDescriptor::extension_scope((FieldDescriptor *)in_RDI[1]._vptr_ExtensionGenerator);
  if (pDVar2 == (Descriptor *)0x0) {
    descriptor_00 = (FileDescriptor *)in_RDI[2]._vptr_ExtensionGenerator;
    this_00 = FieldDescriptor::file((FieldDescriptor *)in_RDI[1]._vptr_ExtensionGenerator);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              ((ClassNameResolver *)this_00,descriptor_00);
    std::__cxx11::string::operator=((string *)(in_RDI + 3),local_68);
    std::__cxx11::string::~string(local_68);
  }
  else {
    FieldDescriptor::extension_scope((FieldDescriptor *)in_RDI[1]._vptr_ExtensionGenerator);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::__cxx11::string::operator=((string *)(in_RDI + 3),local_48);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator(
    const FieldDescriptor* descriptor, Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  if (descriptor_->extension_scope() != NULL) {
    scope_ =
        name_resolver_->GetImmutableClassName(descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}